

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klondike.c
# Opt level: O1

_Bool klondike_isWon(Board *board)

{
  GAMEID GVar1;
  Spot *pSVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  
  GVar1 = (gConfig.game)->id;
  uVar4 = 0xc;
  if (1 < GVar1 - 0x17) {
    if (GVar1 == DOUBLEKLONDIKETURN1) {
      uVar4 = 8;
    }
    else {
      uVar4 = (uint)(GVar1 == DOUBLEKLONDIKETURN3) * 4 + 4;
    }
  }
  bVar3 = false;
  pSVar2 = board_spotGet(board,FOUNDATION,'\0');
  if (pSVar2->cardsCount == '\r') {
    uVar5 = 1;
    do {
      bVar3 = uVar4 <= uVar5;
      if (uVar4 <= uVar5) {
        return bVar3;
      }
      pSVar2 = board_spotGet(board,FOUNDATION,(uchar)uVar5);
      uVar5 = uVar5 + 1;
    } while (pSVar2->cardsCount == '\r');
  }
  return bVar3;
}

Assistant:

bool klondike_isWon(Board * board)
{
	unsigned char i;
	unsigned char foundationCount = (gConfig.game->id==TRIPLEKLONDIKETURN1 || gConfig.game->id==TRIPLEKLONDIKETURN3 ? 12 : (gConfig.game->id==DOUBLEKLONDIKETURN1 || gConfig.game->id==DOUBLEKLONDIKETURN3 ? 8 : 4));
	Spot * foundation;
	for(i=0;i<foundationCount;i++)
	{
		foundation = board_spotGet(board, FOUNDATION, i);
		if(foundation->cardsCount!=13)
			return false;
	}

	return true;
}